

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::SignParameter::SignParameter
          (SignParameter *this,string *text_message,bool der_encode,SigHashType *sighash_type)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> list;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  core::ByteData::ByteData(&this->data_);
  this->data_type_ = kBinary;
  core::Pubkey::Pubkey(&this->related_pubkey_);
  this->der_encode_ = false;
  core::SigHashType::SigHashType(&this->sighash_type_);
  core::ScriptOperator::ScriptOperator
            (&this->op_code_,(ScriptOperator *)core::ScriptOperator::OP_INVALIDOPCODE);
  bVar1 = core::ScriptOperator::IsValid(text_message);
  if (bVar1) {
    this->data_type_ = kOpCode;
    core::ScriptOperator::Get((ScriptOperator *)&list,text_message);
    core::ScriptOperator::operator=(&this->op_code_,(ScriptOperator *)&list);
    core::ScriptOperator::~ScriptOperator((ScriptOperator *)&list);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&list,1,
               (allocator_type *)&local_48);
    *list.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = (char)(this->op_code_).data_type_;
    core::ByteData::ByteData((ByteData *)&local_48,&list);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&list.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    core::ByteData::ByteData((ByteData *)&list,text_message);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               &list.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&list.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    this->der_encode_ = der_encode;
    core::SigHashType::operator=(&this->sighash_type_,sighash_type);
    if (der_encode) {
      this->data_type_ = kSign;
    }
  }
  return;
}

Assistant:

SignParameter::SignParameter(
    const std::string& text_message, bool der_encode,
    const SigHashType sighash_type)
    : data_(),
      data_type_(SignDataType::kBinary),
      related_pubkey_(),
      der_encode_(false),
      sighash_type_(),
      op_code_(ScriptOperator::OP_INVALIDOPCODE) {
  if (ScriptOperator::IsValid(text_message)) {
    data_type_ = SignDataType::kOpCode;
    op_code_ = ScriptOperator::Get(text_message);
    std::vector<uint8_t> list(1);
    list[0] = static_cast<uint8_t>(op_code_.GetDataType());
    data_ = ByteData(list);
  } else {
    data_ = ByteData(text_message);
    der_encode_ = der_encode;
    sighash_type_ = sighash_type;
    if (der_encode) data_type_ = SignDataType::kSign;
  }
}